

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O1

void __thiscall Assimp::PlyExporter::WriteMeshIndices(PlyExporter *this,aiMesh *m,uint offset)

{
  pointer pcVar1;
  ostream *poVar2;
  aiFace *paVar3;
  ulong uVar4;
  long *local_60;
  long local_58;
  long local_50 [2];
  aiMesh *local_40;
  ulong local_38;
  
  if (m->mNumFaces != 0) {
    uVar4 = 0;
    local_40 = m;
    do {
      paVar3 = local_40->mFaces;
      local_38 = uVar4;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      if (paVar3[uVar4].mNumIndices != 0) {
        paVar3 = paVar3 + uVar4;
        uVar4 = 0;
        do {
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this);
          local_60 = local_50;
          if (uVar4 == paVar3->mNumIndices - 1) {
            pcVar1 = (this->endl)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_60,pcVar1,pcVar1 + (this->endl)._M_string_length);
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_60," ","");
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_60,local_58);
          if (local_60 != local_50) {
            operator_delete(local_60,local_50[0] + 1);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < paVar3->mNumIndices);
      }
      uVar4 = local_38 + 1;
    } while (uVar4 < local_40->mNumFaces);
  }
  return;
}

Assistant:

void PlyExporter::WriteMeshIndices(const aiMesh* m, unsigned int offset)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];
        mOutput << f.mNumIndices << " ";
        for(unsigned int c = 0; c < f.mNumIndices; ++c) {
            mOutput << (f.mIndices[c] + offset) << (c == f.mNumIndices-1 ? endl : " ");
        }
    }
}